

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<long,bool,bool,long>
               (ostream *out,char *fmt,long *args,bool *args_1,bool *args_2,long *args_3)

{
  ostream *in_RSI;
  bool *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff38;
  long local_78 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<long,bool,bool,long>
            (local_78,(bool *)in_RSI,in_RDI,(long *)in_stack_ffffffffffffff38);
  vformat(in_RSI,in_RDI,in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}